

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

void __thiscall ON_Mesh::Append(ON_Mesh *this,int mesh_count,ON_Mesh **meshes)

{
  ON_3fVectorArray *pOVar1;
  ON_2fPointArray *this_00;
  ON_2dPointArray *this_01;
  ON_SimpleArray<ON_SurfaceCurvature> *this_02;
  ON_SimpleArray<ON_Color> *this_03;
  int iVar2;
  int iVar3;
  uint uVar4;
  ON_Mesh *pOVar5;
  ON_MeshParameters *pOVar6;
  ON_MeshCurvatureStats *this_04;
  ON_TextureCoordinates *pOVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  uint uVar15;
  uint *puVar16;
  ON_Interval *pOVar17;
  ON_MeshNgon *pOVar18;
  byte bVar19;
  int face_count;
  size_t new_capacity;
  ON_MeshFace *pOVar20;
  bool bVar21;
  byte bVar22;
  ulong uVar23;
  bool bVar24;
  bool bVar25;
  int iVar26;
  bool bVar27;
  uint uVar28;
  ulong uVar29;
  ON_MeshParameters *a;
  uint uVar30;
  bool bVar31;
  bool bVar32;
  int iVar33;
  uint uVar34;
  uint uVar35;
  long lVar36;
  long lVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  double dVar42;
  double dVar43;
  int vertex_count;
  ON_SHA1_Hash mp_hash;
  ON_SHA1_Hash this_mesh_mp_hash;
  uint local_170;
  uint local_114;
  uint local_e4;
  ON_MeshParameters *local_e0;
  double local_c8;
  double dStack_c0;
  ON__UINT8 local_b8 [16];
  undefined1 local_a8 [16];
  ON_Interval local_98;
  ON_Interval local_88;
  ON_Interval local_78;
  double *local_68;
  double *local_60;
  double *local_58;
  double *local_50;
  double local_44;
  double dStack_3c;
  ON__UINT8 local_34 [4];
  
  if (meshes == (ON_Mesh **)0x0 || mesh_count < 1) {
    return;
  }
  uVar15 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  if ((int)uVar15 < 1) {
    if ((this->m_F).m_capacity < 0) {
      local_e4 = (this->m_F).m_count;
    }
    else {
      (this->m_F).m_count = 0;
      local_e4 = 0;
    }
    if (uVar15 == 0) {
      bVar24 = true;
      bVar39 = false;
      bVar31 = true;
      bVar21 = true;
      iVar26 = 1;
      bVar27 = true;
      bVar13 = false;
      bVar25 = true;
      bVar32 = true;
      bVar12 = true;
      goto LAB_00505839;
    }
  }
  else {
    local_e4 = (this->m_F).m_count;
  }
  if (local_e4 == 0) {
    bVar21 = true;
  }
  else {
    bVar21 = (this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count == local_e4 && 0 < (int)local_e4
    ;
  }
  bVar27 = 0 < (int)uVar15 && (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count == uVar15;
  bVar13 = 0 < (int)uVar15;
  bVar38 = (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count == uVar15;
  bVar25 = bVar38 && bVar13;
  bVar31 = (this->m_K).m_count == uVar15 && bVar13;
  bVar32 = (this->m_C).m_count == uVar15 && bVar13;
  bVar39 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count == uVar15;
  bVar24 = bVar39 && bVar13;
  bVar12 = HasSynchronizedDoubleAndSinglePrecisionVertices(this);
  bVar39 = !bVar39 || !bVar13;
  bVar13 = !bVar38 || !bVar13;
  iVar26 = 0;
LAB_00505839:
  iVar14 = NgonCount(this);
  if (iVar14 < 1) {
    bVar38 = false;
  }
  else {
    puVar16 = NgonMap(this);
    bVar38 = puVar16 != (uint *)0x0;
  }
  local_b8[0] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x10];
  local_b8[1] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x11];
  local_b8[2] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x12];
  local_b8[3] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x13];
  local_c8 = (double)ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
  dStack_c0 = (double)ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
  if ((char)iVar26 == '\0') {
    local_e0 = this->m_mesh_parameters;
    bVar40 = local_e0 != (ON_MeshParameters *)0x0;
    if (bVar40) {
      ON_MeshParameters::GeometrySettingsHash((ON_SHA1_Hash *)local_a8,local_e0,false);
      local_b8[0] = local_98.m_t[0]._0_1_;
      local_b8[1] = local_98.m_t[0]._1_1_;
      local_b8[2] = local_98.m_t[0]._2_1_;
      local_b8[3] = local_98.m_t[0]._3_1_;
      local_c8 = (double)local_a8._0_8_;
      dStack_c0 = (double)local_a8._8_8_;
    }
    if ((bVar39 == false) &&
       (bVar39 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x240), bVar39)) {
      bVar39 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x250);
    }
    else {
      bVar39 = false;
    }
  }
  else {
    bVar39 = (bool)(bVar39 ^ 1);
    bVar40 = true;
    local_e0 = (ON_MeshParameters *)0x0;
  }
  lVar36 = 0;
  do {
    ON_Interval::ON_Interval((ON_Interval *)(local_a8 + lVar36));
    lVar36 = lVar36 + 0x10;
  } while (lVar36 != 0x20);
  local_50 = (double *)&this->field_0x240;
  local_58 = (double *)&this->field_0x250;
  bVar41 = (0 < (int)uVar15 & bVar39) != 0;
  pOVar17 = &ON_Interval::EmptyInterval;
  if (bVar41) {
    pOVar17 = (ON_Interval *)local_50;
  }
  local_a8._0_8_ = pOVar17->m_t[0];
  local_a8._8_8_ = pOVar17->m_t[1];
  pOVar17 = &ON_Interval::EmptyInterval;
  if (bVar41) {
    pOVar17 = (ON_Interval *)local_58;
  }
  local_98.m_t[0] = pOVar17->m_t[0];
  local_98.m_t[1] = pOVar17->m_t[1];
  if ((char)iVar26 == '\0' && bVar13 == false) {
    bVar13 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x270);
    if (bVar13) {
      bVar13 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x280);
    }
    else {
      bVar13 = false;
    }
  }
  else {
    bVar13 = (bool)(bVar13 ^ 1);
  }
  lVar36 = 0;
  do {
    ON_Interval::ON_Interval((ON_Interval *)((long)local_88.m_t + lVar36));
    lVar36 = lVar36 + 0x10;
  } while (lVar36 != 0x20);
  local_68 = (double *)&this->field_0x270;
  local_60 = (double *)&this->field_0x280;
  bVar41 = (0 < (int)uVar15 & bVar13) != 0;
  pOVar17 = &ON_Interval::EmptyInterval;
  if (bVar41) {
    pOVar17 = (ON_Interval *)local_68;
  }
  local_88.m_t[0] = pOVar17->m_t[0];
  local_88.m_t[1] = pOVar17->m_t[1];
  pOVar17 = &ON_Interval::EmptyInterval;
  if (bVar41) {
    pOVar17 = (ON_Interval *)local_60;
  }
  local_78.m_t[0] = pOVar17->m_t[0];
  local_78.m_t[1] = pOVar17->m_t[1];
  uVar35 = 0;
  if (bVar13 != false) {
    uVar35 = *(uint *)&this->m_packed_tex_rotate;
  }
  dVar42 = this->m_srf_scale[0];
  dVar43 = this->m_srf_scale[1];
  uVar30 = (uint)(0 < (int)uVar15);
  uVar11 = (ulong)(uint)mesh_count;
  uVar29 = 0;
  local_114 = local_e4;
  local_170 = uVar15;
  do {
    pOVar5 = meshes[uVar29];
    uVar34 = uVar30;
    if ((pOVar5 != (ON_Mesh *)0x0) &&
       (iVar14 = (pOVar5->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count, 0 < iVar14)) {
      if (bVar40) {
        pOVar6 = pOVar5->m_mesh_parameters;
        if (pOVar6 == (ON_MeshParameters *)0x0) {
          bVar40 = false;
        }
        else {
          ON_MeshParameters::GeometrySettingsHash((ON_SHA1_Hash *)&local_44,pOVar6,false);
          if (local_e0 == (ON_MeshParameters *)0x0) {
            local_b8[0] = local_34[0];
            local_b8[1] = local_34[1];
            local_b8[2] = local_34[2];
            local_b8[3] = local_34[3];
            local_c8 = local_44;
            dStack_c0 = dStack_3c;
            local_e0 = pOVar6;
          }
          else {
            bVar41 = ::operator!=((ON_SHA1_Hash *)&local_44,(ON_SHA1_Hash *)&local_c8);
            if (bVar41) {
              bVar40 = false;
            }
          }
        }
      }
      bVar41 = false;
      iVar2 = (pOVar5->m_F).m_count;
      iVar33 = 0;
      if (0 < iVar2) {
        iVar33 = iVar2;
      }
      if (bVar27) {
        iVar3 = (pOVar5->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
        if ((pOVar5->m_N).super_ON_SimpleArray<ON_3fVector>.m_count != iVar3) {
          bVar27 = bVar41;
        }
        if (iVar3 < 1) {
          bVar27 = bVar41;
        }
      }
      if (bVar25) {
        iVar3 = (pOVar5->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
        if ((pOVar5->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count != iVar3) {
          bVar25 = bVar41;
        }
        if (iVar3 < 1) {
          bVar25 = bVar41;
        }
      }
      if (bVar31) {
        iVar3 = (pOVar5->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
        if ((pOVar5->m_K).m_count != iVar3) {
          bVar31 = bVar41;
        }
        if (iVar3 < 1) {
          bVar31 = bVar41;
        }
      }
      if (bVar32) {
        iVar3 = (pOVar5->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
        if ((pOVar5->m_C).m_count != iVar3) {
          bVar32 = bVar41;
        }
        if (iVar3 < 1) {
          bVar32 = bVar41;
        }
      }
      if (bVar24) {
        iVar3 = (pOVar5->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
        if ((pOVar5->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count != iVar3) {
          bVar24 = bVar41;
        }
        if (iVar3 < 1) {
          bVar24 = bVar41;
        }
      }
      if ((bVar12 != false) &&
         (bVar41 = HasSynchronizedDoubleAndSinglePrecisionVertices(pOVar5), !bVar41)) {
        bVar12 = false;
      }
      if (((0 < iVar2) && (bVar21)) &&
         ((pOVar5->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count != iVar2)) {
        bVar21 = false;
      }
      if (bVar39 != false) {
        if (bVar24) {
          bVar39 = ON_Interval::IsIncreasing((ON_Interval *)&pOVar5->field_0x240);
          if (bVar39) {
            bVar39 = ON_Interval::IsIncreasing((ON_Interval *)&pOVar5->field_0x250);
            if (bVar39) {
              ON_Interval::Union((ON_Interval *)local_a8,(ON_Interval *)&pOVar5->field_0x240);
              ON_Interval::Union(&local_98,(ON_Interval *)&pOVar5->field_0x250);
              bVar39 = true;
              goto LAB_00505d66;
            }
          }
          bVar39 = false;
        }
        else {
          bVar39 = false;
        }
      }
LAB_00505d66:
      dVar42 = 0.0;
      dVar43 = 0.0;
      if (((uVar30 == 0) && (bVar24)) && (bVar39 != false)) {
        dVar42 = pOVar5->m_srf_scale[0];
        dVar43 = pOVar5->m_srf_scale[1];
      }
      uVar34 = uVar30 + 1;
      local_114 = local_114 + iVar33;
      local_170 = local_170 + iVar14;
      if (bVar13 != false) {
        bVar41 = false;
        if (bVar25) {
          bVar13 = ON_Interval::IsIncreasing((ON_Interval *)&pOVar5->field_0x270);
          if (bVar13) {
            bVar41 = ON_Interval::IsIncreasing((ON_Interval *)&pOVar5->field_0x280);
          }
          else {
            bVar41 = false;
          }
        }
        bVar22 = (byte)uVar35 & 1;
        uVar4 = *(uint *)&pOVar5->m_packed_tex_rotate;
        bVar19 = (byte)uVar4;
        bVar13 = bVar41;
        if (bVar22 != bVar19) {
          bVar13 = false;
        }
        uVar28 = uVar35 & 0xff;
        uVar35 = uVar28;
        if (uVar15 == 0 && (int)uVar29 == 0) {
          uVar35 = uVar4;
          bVar13 = bVar41;
        }
        if (bVar22 == bVar19) {
          uVar35 = uVar28;
        }
        if (bVar13 == true) {
          bVar41 = bVar13;
          if (((byte)uVar35 & 1) != bVar19) {
            bVar41 = false;
          }
          if (uVar30 != 0) {
            uVar4 = uVar35;
            bVar13 = bVar41;
          }
          uVar35 = uVar4 & 0xff;
          ON_Interval::Union(&local_88,(ON_Interval *)&pOVar5->field_0x270);
          ON_Interval::Union(&local_78,(ON_Interval *)&pOVar5->field_0x280);
        }
      }
    }
    uVar30 = uVar34;
    uVar29 = uVar29 + 1;
  } while (uVar11 != uVar29);
  if (((int)uVar15 < (int)local_170) || ((int)local_e4 < (int)local_114)) {
    if ((!bVar24) || (bVar39 == false)) {
      local_a8._0_8_ = ON_Interval::EmptyInterval.m_t[0];
      local_a8._8_8_ = ON_Interval::EmptyInterval.m_t[1];
      local_98.m_t[0] = ON_Interval::EmptyInterval.m_t[0];
      local_98.m_t[1] = ON_Interval::EmptyInterval.m_t[1];
      dVar42 = 0.0;
      dVar43 = 0.0;
    }
    bVar19 = (byte)uVar35;
    if ((!bVar25) || (bVar13 == false)) {
      local_88.m_t[0] = ON_Interval::EmptyInterval.m_t[0];
      local_88.m_t[1] = ON_Interval::EmptyInterval.m_t[1];
      local_78.m_t[0] = ON_Interval::EmptyInterval.m_t[0];
      local_78.m_t[1] = ON_Interval::EmptyInterval.m_t[1];
      bVar19 = 0;
    }
    *local_50 = (double)local_a8._0_8_;
    local_50[1] = (double)local_a8._8_8_;
    *local_58 = local_98.m_t[0];
    local_58[1] = local_98.m_t[1];
    this->m_srf_scale[0] = dVar42;
    this->m_srf_scale[1] = dVar43;
    *local_68 = local_88.m_t[0];
    local_68[1] = local_88.m_t[1];
    *local_60 = local_78.m_t[0];
    local_60[1] = local_78.m_t[1];
    this->m_packed_tex_rotate = (bool)(bVar19 & 1);
    ON_MeshTopology::Destroy(&this->m_top);
    new_capacity = (size_t)(int)local_170;
    if ((uint)(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_capacity < local_170) {
      ON_SimpleArray<ON_3fPoint>::SetCapacity
                (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,new_capacity);
    }
    if ((uint)(this->m_F).m_capacity < local_114) {
      ON_SimpleArray<ON_MeshFace>::SetCapacity(&this->m_F,(long)(int)local_114);
    }
    uVar29 = 0;
    do {
      pOVar5 = meshes[uVar29];
      if ((pOVar5 != (ON_Mesh *)0x0) &&
         (iVar14 = (pOVar5->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count, 0 < iVar14)) {
        iVar2 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
        iVar33 = (this->m_F).m_count;
        lVar36 = (long)iVar33;
        iVar3 = (pOVar5->m_F).m_count;
        if (0 < iVar3) {
          ON_SimpleArray<ON_MeshFace>::Append(&this->m_F,iVar3,(pOVar5->m_F).m_a);
          pOVar20 = (this->m_F).m_a + lVar36;
          do {
            iVar8 = pOVar20->vi[1];
            iVar9 = pOVar20->vi[2];
            iVar10 = pOVar20->vi[3];
            pOVar20->vi[0] = pOVar20->vi[0] + iVar2;
            pOVar20->vi[1] = iVar8 + iVar2;
            pOVar20->vi[2] = iVar9 + iVar2;
            pOVar20->vi[3] = iVar10 + iVar2;
            lVar36 = lVar36 + 1;
            pOVar20 = pOVar20 + 1;
          } while (lVar36 < iVar3 + iVar33);
        }
        ON_SimpleArray<ON_3fPoint>::Append
                  (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,iVar14,
                   (pOVar5->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a);
        if ((0 < (pOVar5->m_F).m_count) && ((pOVar5->m_Ngon).m_count != 0)) {
          puVar16 = NgonMap(pOVar5);
          bVar38 = (bool)(bVar38 | puVar16 != (uint *)0x0);
          ON_SimpleArray<unsigned_int>::SetCapacity(&this->m_NgonMap,0);
          uVar15 = NgonUnsignedCount(pOVar5);
          if (uVar15 != 0) {
            uVar35 = 0;
            do {
              pOVar18 = Ngon(pOVar5,uVar35);
              if ((pOVar18 != (ON_MeshNgon *)0x0) &&
                 (((pOVar18->m_Vcount != 0 || (pOVar18->m_Fcount != 0)) &&
                  (pOVar18 = ON_MeshNgonAllocator::CopyNgon(&this->m_NgonAllocator,pOVar18),
                  pOVar18 != (ON_MeshNgon *)0x0)))) {
                if (pOVar18->m_Vcount != 0) {
                  puVar16 = pOVar18->m_vi;
                  uVar23 = 0;
                  do {
                    puVar16[uVar23] = puVar16[uVar23] + iVar2;
                    uVar23 = uVar23 + 1;
                  } while (uVar23 < pOVar18->m_Vcount);
                }
                if (pOVar18->m_Fcount != 0) {
                  puVar16 = pOVar18->m_fi;
                  uVar23 = 0;
                  do {
                    puVar16[uVar23] = puVar16[uVar23] + iVar33;
                    uVar23 = uVar23 + 1;
                  } while (uVar23 < pOVar18->m_Fcount);
                }
                AddNgon(this,pOVar18);
              }
              uVar35 = uVar35 + 1;
            } while (uVar35 != uVar15);
          }
        }
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 != uVar11);
    if (bVar12 != false) {
      if ((uint)(this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_capacity < local_170) {
        ON_SimpleArray<ON_3dPoint>::SetCapacity
                  (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,new_capacity);
      }
      uVar29 = 0;
      do {
        pOVar5 = meshes[uVar29];
        if ((pOVar5 != (ON_Mesh *)0x0) &&
           (iVar14 = (pOVar5->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count, 0 < iVar14)) {
          ON_SimpleArray<ON_3dPoint>::Append
                    (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,iVar14,
                     (pOVar5->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a);
        }
        uVar29 = uVar29 + 1;
      } while (uVar11 != uVar29);
      if ((this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count != local_170) {
        bVar12 = false;
      }
    }
    if (bVar12 == false) {
      ON_SimpleArray<ON_3dPoint>::SetCapacity(&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,0);
    }
    pOVar1 = &this->m_N;
    if (bVar27) {
      if ((uint)(this->m_N).super_ON_SimpleArray<ON_3fVector>.m_capacity < local_170) {
        ON_SimpleArray<ON_3fVector>::SetCapacity
                  (&pOVar1->super_ON_SimpleArray<ON_3fVector>,new_capacity);
      }
      uVar29 = 0;
      do {
        pOVar5 = meshes[uVar29];
        if (pOVar5 != (ON_Mesh *)0x0) {
          ON_SimpleArray<ON_3fVector>::Append
                    (&pOVar1->super_ON_SimpleArray<ON_3fVector>,
                     (pOVar5->m_N).super_ON_SimpleArray<ON_3fVector>.m_count,
                     (pOVar5->m_N).super_ON_SimpleArray<ON_3fVector>.m_a);
        }
        uVar29 = uVar29 + 1;
      } while (uVar11 != uVar29);
    }
    else {
      ON_SimpleArray<ON_3fVector>::SetCapacity(&pOVar1->super_ON_SimpleArray<ON_3fVector>,0);
    }
    pOVar1 = &this->m_FN;
    if (bVar21) {
      if ((uint)(this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_capacity < local_114) {
        ON_SimpleArray<ON_3fVector>::SetCapacity
                  (&pOVar1->super_ON_SimpleArray<ON_3fVector>,(long)(int)local_114);
      }
      uVar29 = 0;
      do {
        pOVar5 = meshes[uVar29];
        if ((pOVar5 != (ON_Mesh *)0x0) &&
           (0 < (pOVar5->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count)) {
          ON_SimpleArray<ON_3fVector>::Append
                    (&pOVar1->super_ON_SimpleArray<ON_3fVector>,
                     (pOVar5->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count,
                     (pOVar5->m_FN).super_ON_SimpleArray<ON_3fVector>.m_a);
        }
        uVar29 = uVar29 + 1;
      } while (uVar11 != uVar29);
    }
    else {
      ON_SimpleArray<ON_3fVector>::SetCapacity(&pOVar1->super_ON_SimpleArray<ON_3fVector>,0);
    }
    this_00 = &this->m_T;
    if (bVar25) {
      if ((uint)(this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_capacity < local_170) {
        ON_SimpleArray<ON_2fPoint>::SetCapacity
                  (&this_00->super_ON_SimpleArray<ON_2fPoint>,new_capacity);
      }
      uVar29 = 0;
      do {
        pOVar5 = meshes[uVar29];
        if (pOVar5 != (ON_Mesh *)0x0) {
          ON_SimpleArray<ON_2fPoint>::Append
                    (&this_00->super_ON_SimpleArray<ON_2fPoint>,
                     (pOVar5->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count,
                     (pOVar5->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a);
        }
        uVar29 = uVar29 + 1;
      } while (uVar11 != uVar29);
    }
    else {
      ON_SimpleArray<ON_2fPoint>::SetCapacity(&this_00->super_ON_SimpleArray<ON_2fPoint>,0);
    }
    this_01 = &this->m_S;
    if (bVar24) {
      if ((uint)(this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity < local_170) {
        ON_SimpleArray<ON_2dPoint>::SetCapacity
                  (&this_01->super_ON_SimpleArray<ON_2dPoint>,new_capacity);
      }
      uVar29 = 0;
      do {
        pOVar5 = meshes[uVar29];
        if (pOVar5 != (ON_Mesh *)0x0) {
          ON_SimpleArray<ON_2dPoint>::Append
                    (&this_01->super_ON_SimpleArray<ON_2dPoint>,
                     (pOVar5->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count,
                     (pOVar5->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a);
        }
        uVar29 = uVar29 + 1;
      } while (uVar11 != uVar29);
    }
    else {
      ON_SimpleArray<ON_2dPoint>::SetCapacity(&this_01->super_ON_SimpleArray<ON_2dPoint>,0);
    }
    this_02 = &this->m_K;
    if (bVar31) {
      if ((uint)(this->m_K).m_capacity < local_170) {
        ON_SimpleArray<ON_SurfaceCurvature>::SetCapacity(this_02,new_capacity);
      }
      uVar29 = 0;
      do {
        pOVar5 = meshes[uVar29];
        if (pOVar5 != (ON_Mesh *)0x0) {
          ON_SimpleArray<ON_SurfaceCurvature>::Append
                    (this_02,(pOVar5->m_K).m_count,(pOVar5->m_K).m_a);
        }
        uVar29 = uVar29 + 1;
      } while (uVar11 != uVar29);
    }
    else {
      ON_SimpleArray<ON_SurfaceCurvature>::SetCapacity(this_02,0);
    }
    this_03 = &this->m_C;
    if (bVar32) {
      if ((uint)(this->m_C).m_capacity < local_170) {
        ON_SimpleArray<ON_Color>::SetCapacity(this_03,new_capacity);
      }
      uVar29 = 0;
      do {
        pOVar5 = meshes[uVar29];
        if (pOVar5 != (ON_Mesh *)0x0) {
          ON_SimpleArray<ON_Color>::Append(this_03,(pOVar5->m_C).m_count,(pOVar5->m_C).m_a);
        }
        uVar29 = uVar29 + 1;
      } while (uVar11 != uVar29);
    }
    else {
      ON_SimpleArray<ON_Color>::SetCapacity(this_03,0);
    }
    if (this->m_mesh_parameters != (ON_MeshParameters *)0x0) {
      uVar29 = 0;
      do {
        if (meshes[uVar29] != (ON_Mesh *)0x0) {
          pOVar6 = meshes[uVar29]->m_mesh_parameters;
          a = this->m_mesh_parameters;
          if (pOVar6 != (ON_MeshParameters *)0x0) {
            iVar14 = ON_MeshParameters::Compare(a,pOVar6);
            if (iVar14 == 0) goto LAB_005064b5;
            a = this->m_mesh_parameters;
          }
          operator_delete(a,0xe0);
          this->m_mesh_parameters = (ON_MeshParameters *)0x0;
          break;
        }
LAB_005064b5:
        uVar29 = uVar29 + 1;
      } while (uVar11 != uVar29);
    }
    lVar36 = 0xd7;
    do {
      this_04 = (ON_MeshCurvatureStats *)
                (&(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object)[lVar36];
      if (this_04 != (ON_MeshCurvatureStats *)0x0) {
        ON_MeshCurvatureStats::~ON_MeshCurvatureStats(this_04);
        operator_delete(this_04,0x40);
        (&(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object)[lVar36] = (_func_int **)0x0;
      }
      lVar36 = lVar36 + 1;
    } while (lVar36 != 0xdb);
    uVar29 = 0;
    do {
      pOVar5 = meshes[uVar29];
      if (pOVar5 != (ON_Mesh *)0x0) {
        if (iVar26 == 0) {
          iVar26 = 0;
          if (0 < (this->m_TC).m_count) {
            do {
              if ((pOVar5->m_TC).m_count < 1) {
LAB_00506657:
                ON_ClassArray<ON_TextureCoordinates>::Remove(&this->m_TC,iVar26);
                iVar26 = iVar26 + -1;
              }
              else {
                lVar36 = 0;
                bVar13 = false;
                do {
                  lVar37 = lVar36 * 0xb8;
                  while (bVar21 = ::operator==(&(this->m_TC).m_a[iVar26].m_tag,
                                               (ON_MappingTag *)
                                               ((((pOVar5->m_TC).m_a)->m_tag).m_mapping_id.Data4 +
                                               lVar37 + -8)), !bVar21) {
                    lVar36 = lVar36 + 1;
                    lVar37 = lVar37 + 0xb8;
                    if ((pOVar5->m_TC).m_count <= lVar36) {
                      if (bVar13) goto LAB_00506665;
                      goto LAB_00506657;
                    }
                  }
                  pOVar7 = (pOVar5->m_TC).m_a;
                  ON_SimpleArray<ON_3fPoint>::Append
                            (&(this->m_TC).m_a[iVar26].m_T,
                             *(int *)((long)&(pOVar7->m_T).m_count + lVar37),
                             *(ON_3fPoint **)((long)&(pOVar7->m_T).m_a + lVar37));
                  lVar36 = lVar36 + 1;
                  bVar13 = true;
                } while (lVar36 < (pOVar5->m_TC).m_count);
              }
LAB_00506665:
              iVar26 = iVar26 + 1;
            } while (iVar26 < (this->m_TC).m_count);
            iVar26 = 0;
          }
        }
        else {
          ON_ClassArray<ON_TextureCoordinates>::operator=(&this->m_TC,&pOVar5->m_TC);
          iVar26 = 0;
        }
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 != uVar11);
    this->m_mesh_is_closed = '\0';
    this->m_mesh_is_manifold = '\0';
    this->m_mesh_is_oriented = '\0';
    this->m_mesh_is_solid = '\0';
    InvalidateBoundingBoxes(this);
    iVar26 = NgonCount(this);
    if ((bool)(0 < iVar26 & bVar38)) {
      CreateNgonMap(this);
    }
    if (((bVar40) && (local_e0 != (ON_MeshParameters *)0x0)) &&
       (local_e0 != this->m_mesh_parameters)) {
      SetMeshParameters(this,local_e0);
    }
  }
  return;
}

Assistant:

void ON_Mesh::Append(int mesh_count, const ON_Mesh* const* meshes)
{
  if (mesh_count <= 0 || 0 == meshes)
    return;

  int mi;
  int vcount0 = VertexCount();
  if (vcount0 <= 0)
    m_F.SetCount(0);
  int fcount0 = FaceCount();
  int* vi;
  int j;
  const ON_Mesh* m;

  // The calls to Has*() must happen before the m_V[] and m_F[] arrays get enlarged
  // Allow the appendage of VertexNormals, TextureCoordinates, PrincipalCurvatures to empty meshes
  // by checking for 0 == vcount0 && 0 == fcount0
  bool bHasVertexNormals = (0 == vcount0 || HasVertexNormals());
  bool bHasFaceNormals = (0 == vcount0 || 0 == fcount0 || HasFaceNormals());
  bool bHasTextureCoordinates = (0 == vcount0 || HasTextureCoordinates());
  bool bHasPrincipalCurvatures = (0 == vcount0 || HasPrincipalCurvatures());
  bool bHasVertexColors = (0 == vcount0 || HasVertexColors());
  bool bHasSurfaceParameters = (0 == vcount0 || HasSurfaceParameters());
  bool bHasDoubles = (0 == vcount0 || HasSynchronizedDoubleAndSinglePrecisionVertices());
  bool bHasNgonMap = (NgonCount() > 0 && 0 != NgonMap());

  bool bSetMeshParameters = true;
  const ON_MeshParameters* mp = nullptr;
  ON_SHA1_Hash mp_hash = ON_SHA1_Hash::EmptyContentHash;
  if (0 != vcount0)
  {
    mp = this->MeshParameters();
    if (nullptr == mp)
      bSetMeshParameters = false;
    else
      mp_hash = mp->GeometrySettingsHash();
  }

  bool bHasSurfaceDomain
    = bHasSurfaceParameters
    && (0 == vcount0 || (m_srf_domain[0].IsIncreasing() && m_srf_domain[1].IsIncreasing()));

  ON_Interval srf_domain[2];
  srf_domain[0] = (bHasSurfaceDomain && vcount0 > 0) ? m_srf_domain[0] : ON_Interval::EmptyInterval;
  srf_domain[1] = (bHasSurfaceDomain && vcount0 > 0) ? m_srf_domain[1] : ON_Interval::EmptyInterval;

  bool bHasTexturePackingDomain
    = bHasTextureCoordinates
    && (0 == vcount0 || (m_packed_tex_domain[0].IsIncreasing() && m_packed_tex_domain[1].IsIncreasing()));

  ON_Interval packed_tex_domain[2];
  packed_tex_domain[0] = (bHasTexturePackingDomain && vcount0 > 0) ? m_packed_tex_domain[0] : ON_Interval::EmptyInterval;
  packed_tex_domain[1] = (bHasTexturePackingDomain && vcount0 > 0) ? m_packed_tex_domain[1] : ON_Interval::EmptyInterval;
  bool packed_tex_rotate = (bHasTexturePackingDomain && m_packed_tex_rotate) ? true : false;

  double srf_scale[2] = { m_srf_scale[0], m_srf_scale[1] };

  int fcount = fcount0;
  int vcount = vcount0;
  unsigned int merged_count = vcount0 > 0 ? 1 : 0;
  for (mi = 0; mi < mesh_count; mi++)
  {
    m = meshes[mi];
    if (0 == m)
      continue;
    int vcount1 = m->m_V.Count();
    if (vcount1 <= 0)
      continue;

    merged_count++;

    if (bSetMeshParameters)
    {
      const ON_MeshParameters* this_mesh_mp = m->MeshParameters();
      if (nullptr == this_mesh_mp)
        bSetMeshParameters = false;
      else
      {
        const ON_SHA1_Hash this_mesh_mp_hash = this_mesh_mp->GeometrySettingsHash();
        if (nullptr == mp)
        {
          // first mesh parameters.
          mp = this_mesh_mp;
          mp_hash = this_mesh_mp_hash;
        }
        else
        {
          if (this_mesh_mp_hash != mp_hash)
          {
            // variable mesh paramters - means output gets none.
            bSetMeshParameters = false;
          }
        }
      }
    }

    int fcount1 = m->m_F.Count();
    if (fcount1 > 0)
      fcount += fcount1;
    vcount += vcount1;
    if (bHasVertexNormals && !m->HasVertexNormals())
      bHasVertexNormals = false;
    if (bHasTextureCoordinates && !m->HasTextureCoordinates())
      bHasTextureCoordinates = false;
    if (bHasPrincipalCurvatures && !m->HasPrincipalCurvatures())
      bHasPrincipalCurvatures = false;
    if (bHasVertexColors && !m->HasVertexColors())
      bHasVertexColors = false;
    if (bHasSurfaceParameters && !m->HasSurfaceParameters())
      bHasSurfaceParameters = false;
    if (bHasDoubles && !m->HasSynchronizedDoubleAndSinglePrecisionVertices())
      bHasDoubles = false;
    if (bHasFaceNormals && fcount1 > 0 && !m->HasFaceNormals())
      bHasFaceNormals = false;

    if (bHasSurfaceDomain)
    {
      bHasSurfaceDomain
        = bHasSurfaceParameters
        && m->m_srf_domain[0].IsIncreasing()
        && m->m_srf_domain[1].IsIncreasing();
      if (bHasSurfaceDomain)
      {
        srf_domain[0].Union(m->m_srf_domain[0]);
        srf_domain[1].Union(m->m_srf_domain[1]);
      }
    }

    if (1 == merged_count && bHasSurfaceParameters && bHasSurfaceDomain)
    {
      srf_scale[0] = m->m_srf_scale[0];
      srf_scale[1] = m->m_srf_scale[1];
    }
    else
    {
      srf_scale[0] = 0.0;
      srf_scale[1] = 0.0;
    }

    if (bHasTexturePackingDomain)
    {
      // 2014-04-01 Dale Lear
      //   Trying to merger packed_tex_domain[] intervals
      //   is questionable at best.
      //   A strong argument can be made for simply deleting
      //   packed texture domain information when there are
      //   two non-empty meshes that are merged.
      bHasTexturePackingDomain
        = bHasTextureCoordinates
        && m->m_packed_tex_domain[0].IsIncreasing()
        && m->m_packed_tex_domain[1].IsIncreasing();
      if (packed_tex_rotate != (m->m_packed_tex_rotate ? true : false))
      {
        if (0 == vcount0 && 0 == mi)
        {
          packed_tex_rotate = (m->m_packed_tex_rotate ? true : false);
        }
        else
        {
          bHasTexturePackingDomain = false;
        }
      }
      if (bHasTexturePackingDomain)
      {
        if (1 == merged_count)
        {
          packed_tex_rotate = (m->m_packed_tex_rotate ? true : false);
        }
        else if (packed_tex_rotate != (m->m_packed_tex_rotate ? true : false))
        {
          bHasTexturePackingDomain = false;
        }
        packed_tex_domain[0].Union(m->m_packed_tex_domain[0]);
        packed_tex_domain[1].Union(m->m_packed_tex_domain[1]);
      }
    }
  }


  if (vcount <= vcount0 && fcount <= fcount0)
    return;

  if (!bHasSurfaceParameters || !bHasSurfaceDomain)
  {
    srf_domain[0] = ON_Interval::EmptyInterval;
    srf_domain[1] = ON_Interval::EmptyInterval;
    srf_scale[0] = 0.0;
    srf_scale[1] = 0.0;
  }

  if (!bHasTextureCoordinates || !bHasTexturePackingDomain)
  {
    packed_tex_domain[0] = ON_Interval::EmptyInterval;
    packed_tex_domain[1] = ON_Interval::EmptyInterval;
    packed_tex_rotate = false;
  }

  m_srf_domain[0] = srf_domain[0];
  m_srf_domain[1] = srf_domain[1];
  m_srf_scale[0] = srf_scale[0];
  m_srf_scale[1] = srf_scale[1];

  m_packed_tex_domain[0] = packed_tex_domain[0];
  m_packed_tex_domain[1] = packed_tex_domain[1];
  m_packed_tex_rotate = packed_tex_rotate;

  m_top.Destroy();

  // It is critical to call DoublePrecisionVertices() before 
  // we modify m_V[] because DoublePrecisionVertices() will
  // attempt to update the double precision information
  // when it notices that m_V has new vertices added.

  m_V.Reserve(vcount);
  m_F.Reserve(fcount);
  for (mi = 0; mi < mesh_count; mi++)
  {
    const unsigned int vcount0_local = m_V.UnsignedCount();
    const unsigned int fcount0_local = m_F.UnsignedCount();
    m = meshes[mi];
    if (0 == m)
      continue;
    int vcount1 = m->m_V.Count();
    if (vcount1 <= 0)
      continue;
    int fcount1 = m->m_F.Count();
    if (fcount1 > 0)
    {
      j = m_F.Count();
      m_F.Append(fcount1, m->m_F.Array());
      fcount1 += j;
      while (j < fcount1)
      {
        vi = m_F[j].vi;
        vi[0] += (int)vcount0_local;
        vi[1] += (int)vcount0_local;
        vi[2] += (int)vcount0_local;
        vi[3] += (int)vcount0_local;
        j++;
      }
    }
    m_V.Append(vcount1, m->m_V.Array());
    if (m->HasNgons())
    {
      if (0 != m->NgonMap())
        bHasNgonMap = true;
      m_NgonMap.Destroy();
      unsigned int ngon_count = m->NgonUnsignedCount();
      for (unsigned int ni = 0; ni < ngon_count; ni++)
      {
        const ON_MeshNgon* ngon0 = m->Ngon(ni);
        if (0 == ngon0)
          continue;
        if (0 == ngon0->m_Vcount && 0 == ngon0->m_Fcount)
          continue;
        ON_MeshNgon* ngon1 = this->m_NgonAllocator.CopyNgon(ngon0);
        if (0 == ngon1)
          continue;
        for (unsigned int nvi = 0; nvi < ngon1->m_Vcount; nvi++)
        {
          ngon1->m_vi[nvi] += vcount0_local;
        }
        for (unsigned int nfi = 0; nfi < ngon1->m_Fcount; nfi++)
        {
          ngon1->m_fi[nfi] += fcount0_local;
        }
        this->AddNgon(ngon1);
      }
    }
  }

  if (bHasDoubles)
  {
    // Now update the double precision vertex locations.
    m_dV.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m || m->m_dV.Count() <= 0)
        continue;
      m_dV.Append(m->m_dV.Count(), m->m_dV.Array());
    }
    if (m_dV.Count() != vcount)
      bHasDoubles = false;
  }

  if (false == bHasDoubles)
  {
    bHasDoubles = false;
    DestroyDoublePrecisionVertices();
  }

  if (bHasVertexNormals)
  {
    m_N.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      m_N.Append(m->m_N.Count(), m->m_N.Array());
    }
  }
  else
  {
    m_N.Destroy();
  }


  if (bHasFaceNormals)
  {
    m_FN.Reserve(fcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m || m->m_V.Count() <= 0)
        continue;
      m_FN.Append(m->m_FN.Count(), m->m_FN.Array());
    }
  }
  else
  {
    m_FN.Destroy();
  }

  if (bHasTextureCoordinates)
  {
    m_T.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      m_T.Append(m->m_T.Count(), m->m_T.Array());
    }
  }
  else
  {
    m_T.Destroy();
  }


  if (bHasSurfaceParameters)
  {
    m_S.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      m_S.Append(m->m_S.Count(), m->m_S.Array());
    }
  }
  else
  {
    m_S.Destroy();
  }

  if (bHasPrincipalCurvatures)
  {
    m_K.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      m_K.Append(m->m_K.Count(), m->m_K.Array());
    }
  }
  else
  {
    m_K.Destroy();
  }

  if (bHasVertexColors)
  {
    m_C.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      m_C.Append(m->m_C.Count(), m->m_C.Array());
    }
  }
  else
  {
    m_C.Destroy();
  }

  if (0 != m_mesh_parameters)
  {
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      if (0 == m->m_mesh_parameters || *m_mesh_parameters != *m->m_mesh_parameters)
      {
        delete m_mesh_parameters;
        m_mesh_parameters = 0;
        break;
      }
    }
  }

  for (j = 0; j < 4; j++)
  {
    if (m_kstat[j])
    {
      // will be recomputed if required
      delete m_kstat[j];
      m_kstat[j] = 0;
    }
  }

  bool bAllowNewCachedTCs = (vcount0 == 0);
  for (mi = 0; mi < mesh_count; mi++)
  {
    m = meshes[mi];
    if (0 == m)
      continue;

    if (bAllowNewCachedTCs)
    {
      m_TC = m->m_TC;
      bAllowNewCachedTCs = false;
    }
    else
    {
      for (int tci = 0; tci < m_TC.Count(); tci++)
      {
        bool bKeep = false;
        for (int tcimi = 0; tcimi < m->m_TC.Count(); tcimi++)
        {
          if (m_TC[tci].m_tag == m->m_TC[tcimi].m_tag)
          {
            m_TC[tci].m_T.Append(m->m_TC[tcimi].m_T.Count(), m->m_TC[tcimi].m_T.Array());
            bKeep = true;
          }
        }
        if (!bKeep)
        {
          m_TC.Remove(tci);
          tci--;
        }
      }
    }
  }

  SetClosed(-99);
  SetSolidOrientation(-99);
  InvalidateBoundingBoxes();

  if (NgonCount() > 0 && bHasNgonMap)
    CreateNgonMap();

  if (bSetMeshParameters && nullptr != mp && mp != this->MeshParameters())
  {
    // Appending to an empty this and all appendees have matching mesh parameters.
    this->SetMeshParameters(*mp);
  }
}